

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

EraseResult __thiscall
absl::status_internal::StatusRep::ErasePayload(StatusRep *this,string_view type_url)

{
  bool bVar1;
  status_internal *this_00;
  uintptr_t uVar2;
  pointer pIVar3;
  pointer this_01;
  iterator pPVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  uintptr_t extraout_RAX;
  char *in_RCX;
  optional<unsigned_long> oVar7;
  EraseResult EVar8;
  string_view type_url_00;
  _Storage<unsigned_long,_true> local_40;
  optional<unsigned_long> index;
  StatusRep *this_local;
  string_view type_url_local;
  EraseResult result;
  
  type_url_00._M_len = type_url._M_str;
  index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = this;
  this_00 = (status_internal *)
            std::
            unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
            ::get(&this->payloads_);
  type_url_00._M_str = in_RCX;
  oVar7 = FindPayloadIndexByUrl(this_00,(Payloads *)type_url._M_len,type_url_00);
  local_40._M_value =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)&local_40);
  if (bVar1) {
    pIVar3 = std::
             unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             ::operator->(&this->payloads_);
    this_01 = std::
              unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
              ::operator->(&this->payloads_);
    pPVar4 = InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
             ::begin(this_01);
    puVar5 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_40);
    InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
    ::erase(pIVar3,pPVar4 + *puVar5);
    pIVar3 = std::
             unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             ::operator->(&this->payloads_);
    bVar1 = InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
            ::empty(pIVar3);
    if ((bVar1) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
      type_url_local._M_str._0_1_ = 1;
      result._0_8_ = Status::CodeToInlinedRep(this->code_);
      Unref(this);
      uVar2 = extraout_RAX;
    }
    else {
      type_url_local._M_str._0_1_ = 1;
      uVar2 = Status::PointerToRep(this);
      result._0_8_ = uVar2;
    }
  }
  else {
    type_url_local._M_str._0_1_ = 0;
    uVar2 = Status::PointerToRep(this);
    result._0_8_ = uVar2;
  }
  EVar8._1_7_ = (undefined7)(uVar2 >> 8);
  EVar8.erased = (bool)type_url_local._M_str._0_1_;
  EVar8.new_rep = result._0_8_;
  return EVar8;
}

Assistant:

StatusRep::EraseResult StatusRep::ErasePayload(absl::string_view type_url) {
  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (!index.has_value()) return {false, Status::PointerToRep(this)};
  payloads_->erase(payloads_->begin() + index.value());
  if (payloads_->empty() && message_.empty()) {
    // Special case: If this can be represented inlined, it MUST be inlined
    // (== depends on this behavior).
    EraseResult result = {true, Status::CodeToInlinedRep(code_)};
    Unref();
    return result;
  }
  return {true, Status::PointerToRep(this)};
}